

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O3

void __thiscall TRM::VertexList::append(VertexList *this,VertexList *other)

{
  Vertex *pVVar1;
  Vertex *pVVar2;
  
  pVVar1 = (other->super_LinkedList<TRM::Vertex>).head;
  if (pVVar1 != (Vertex *)0x0) {
    pVVar2 = (this->super_LinkedList<TRM::Vertex>).tail;
    if (pVVar2 == (Vertex *)0x0) {
      (this->super_LinkedList<TRM::Vertex>).head = pVVar1;
    }
    else {
      pVVar2->next = pVVar1;
      pVVar1->prev = pVVar2;
    }
    (this->super_LinkedList<TRM::Vertex>).tail = (other->super_LinkedList<TRM::Vertex>).tail;
  }
  return;
}

Assistant:

void VertexList::append(VertexList const& other) {
  if (other.head == nullptr) {
    return;
  }

  if (tail) {
    tail->next = other.head;
    other.head->prev = tail;
  } else {
    head = other.head;
  }

  tail = other.tail;
}